

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

void __thiscall
cmConditionEvaluator::cmArgumentList::
ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
          (cmArgumentList *this,bool value,CurrentAndNextIter args)

{
  undefined7 in_register_00000031;
  string sStack_68;
  cmExpandedCommandArgument local_48;
  
  (anonymous_namespace)::bool2string_abi_cxx11_
            (&sStack_68,(_anonymous_namespace_ *)CONCAT71(in_register_00000031,value),
             args.current._M_node._0_1_);
  cmExpandedCommandArgument::cmExpandedCommandArgument(&local_48,&sStack_68,true);
  cmExpandedCommandArgument::operator=
            ((cmExpandedCommandArgument *)(args.current._M_node._M_node + 1),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::erase
            (&this->
              super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>,
             (_List_node_base *)args.next._M_node);
  return;
}

Assistant:

void ReduceOneArg(const bool value, Iter args)
  {
    *args.current = cmExpandedCommandArgument(bool2string(value), true);
    this->erase(args.next);
  }